

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall DnsStats::LoadRegisteredTLD_from_memory(DnsStats *this)

{
  uint8_t *tld;
  ulong in_RAX;
  TldAsKey *this_00;
  size_t tld_len;
  long lVar1;
  bool stored;
  undefined8 uStack_38;
  
  lVar1 = 0;
  uStack_38 = in_RAX;
  do {
    uStack_38 = uStack_38 & 0xffffffffffffff;
    this_00 = (TldAsKey *)operator_new(0x70);
    tld = (uint8_t *)RegisteredTldName[lVar1];
    tld_len = strlen((char *)tld);
    TldAsKey::TldAsKey(this_00,tld,tld_len);
    BinHash<TldAsKey>::InsertOrAdd
              (&this->registeredTld,this_00,false,(bool *)((long)&uStack_38 + 7));
    if (uStack_38._7_1_ == '\0') {
      TldAsKey::~TldAsKey(this_00);
      operator_delete(this_00);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x5a3);
  return;
}

Assistant:

void DnsStats::LoadRegisteredTLD_from_memory()
{
    for (size_t i = 0; i < RegisteredTldNameNb; i++)
    {
        bool stored = false;
        TldAsKey * tak = new
            TldAsKey((uint8_t *) RegisteredTldName[i], strlen(RegisteredTldName[i]));

        registeredTld.InsertOrAdd(tak, false, &stored);

        if (!stored)
        {
            delete tak;
        }
    }
}